

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

cmCMakePath * __thiscall
cmCMakePath::GetNarrowStem(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  string stem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  path local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::filesystem::__cxx11::path::stem(&local_58,&this->Path);
  std::filesystem::__cxx11::path::string(&stem,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  if (stem._M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char)&stem,0x2e);
    if (lVar1 != -1) {
      source = &local_30;
      std::__cxx11::string::substr((ulong)source,(ulong)&stem);
      cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,source,generic_format);
      goto LAB_00254763;
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stem._M_dataplus._M_p == &stem.field_2) {
    local_78.field_2._8_8_ = stem.field_2._8_8_;
  }
  else {
    local_78._M_dataplus._M_p = stem._M_dataplus._M_p;
  }
  source = &local_78;
  local_78._M_string_length = stem._M_string_length;
  stem._M_string_length = 0;
  stem.field_2._M_local_buf[0] = '\0';
  stem._M_dataplus._M_p = (pointer)&stem.field_2;
  cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,source,generic_format);
LAB_00254763:
  std::__cxx11::string::~string((string *)source);
  std::__cxx11::string::~string((string *)&stem);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetNarrowStem() const
{
  auto stem = this->Path.stem().string();
  if (!stem.empty()) {
    auto pos = stem.find('.', stem[0] == '.' ? 1 : 0);
    if (pos != std::string::npos) {
      return stem.substr(0, pos);
    }
  }
  return stem;
}